

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_list.hpp
# Opt level: O0

TestSuite *
iutest::detail::FindList<iutest::TestSuite*,iutest::TestSuite::FindOp>
          (vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_> *list,FindOp *f)

{
  bool bVar1;
  reference ppTVar2;
  __normal_iterator<iutest::TestSuite_*const_*,_std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>_>
  local_30;
  const_iterator end;
  const_iterator it;
  FindOp *f_local;
  vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_> *list_local;
  
  end = std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>::begin(list);
  local_30._M_current =
       (TestSuite **)
       std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>::end(list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar1) {
      return (TestSuite *)0x0;
    }
    ppTVar2 = __gnu_cxx::
              __normal_iterator<iutest::TestSuite_*const_*,_std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>_>
              ::operator*(&end);
    bVar1 = TestSuite::FindOp::operator()(f,*ppTVar2);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<iutest::TestSuite_*const_*,_std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>_>
    ::operator++(&end);
  }
  ppTVar2 = __gnu_cxx::
            __normal_iterator<iutest::TestSuite_*const_*,_std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>_>
            ::operator*(&end);
  return *ppTVar2;
}

Assistant:

T FindList(const ::std::vector<T>& list, Fn& f)
{
    for(typename ::std::vector<T>::const_iterator it = list.begin(), end = list.end(); it != end; ++it)
    {
        if(f(*it))
        {
            return *it;
        }
    }
    return NULL;
}